

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  int iVar2;
  __pid_t _Var3;
  size_t sVar4;
  int *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  int extraout_RDX_00 [2];
  char *pcVar9;
  undefined8 uVar10;
  size_type sVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long lVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  int aiVar15 [2];
  int aiVar16 [2];
  int local_13c;
  string local_138;
  int local_118;
  int local_114;
  int pipe_fd [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar4 = GetThreadCount();
  if (sVar4 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_70,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                       ,0x344);
    Message::Message((Message *)&local_d0);
    _Var7._M_p = local_d0._M_dataplus._M_p;
    poVar1 = (ostream *)(local_d0._M_dataplus._M_p + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (sVar4 == 0) {
      lVar13 = 0x26;
      pcVar9 = "couldn\'t detect the number of threads.";
    }
    else {
      lVar13 = 9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar9 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar9,lVar13);
    StringStreamToString(&local_90,(stringstream *)_Var7._M_p);
    if ((stringstream *)_Var7._M_p != (stringstream *)0x0) {
      (**(code **)(*(long *)_Var7._M_p + 8))(_Var7._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_90._M_dataplus._M_p,local_90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_70);
  }
  iVar2 = pipe(&local_118);
  if (iVar2 == -1) {
    aiVar15 = (int  [2])&local_100;
    pipe_fd = aiVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"CHECK failed: File ","");
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                       );
    aiVar16 = (int  [2])&local_b0.field_2;
    local_b0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar12 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar12) {
      local_b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_b0._M_dataplus._M_p = (pointer)aiVar16;
    }
    else {
      local_b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    local_b0._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_b0,", line ");
    paVar12 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar14 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar14) {
      local_50.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_50._M_dataplus._M_p = (pointer)paVar12;
    }
    else {
      local_50.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_50._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    local_138._M_dataplus._M_p._0_4_ = 0x348;
    StreamableToString<int>(&local_f0,(int *)&local_138);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar12) {
      uVar10 = local_50.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_f0._M_string_length + local_50._M_string_length) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar10 = local_f0.field_2._M_allocated_capacity;
      }
      _Var7._M_p = local_50._M_dataplus._M_p;
      sVar11 = local_50._M_string_length;
      if (local_f0._M_string_length + local_50._M_string_length <= (ulong)uVar10) goto LAB_001437f4;
    }
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_50,local_f0._M_dataplus._M_p,local_f0._M_string_length);
LAB_00143804:
    local_70._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar14 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar14) {
      local_70.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_70._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar6->_M_string_length = 0;
    paVar14->_M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70,": ");
    paVar14 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar8) {
      local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_d0._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_d0._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_d0,"pipe(pipe_fd) != -1");
    local_90._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar8) {
      local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_90._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort(&local_90);
    pbVar6 = extraout_RAX_00;
    local_90._M_dataplus._M_p = (pointer)extraout_RDX_00;
  }
  else {
    aiVar15 = (int  [2])&local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)aiVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &DeathTest::last_death_test_message__abi_cxx11_,&local_90);
    if ((int  [2])local_90._M_dataplus._M_p != aiVar15) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var3 = fork();
    if (_Var3 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var3;
      if (_Var3 == 0) {
        do {
          iVar2 = close(local_118);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_114;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"CHECK failed: File ","");
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_f0,
                        "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                       );
        pipe_fd = (int  [2])(pbVar6->_M_dataplus)._M_p;
        paVar12 = &pbVar6->field_2;
        if (pipe_fd == (int  [2])paVar12) {
          local_100._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_100._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          pipe_fd = (int  [2])&local_100;
        }
        else {
          local_100._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd
                        ,", line ");
        local_b0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar12 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == paVar12) {
          local_b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_b0._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        local_13c = 0x359;
        StreamableToString<int>(&local_138,&local_13c);
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          uVar10 = local_b0.field_2._M_allocated_capacity;
        }
        sVar11 = local_b0._M_string_length;
        if ((ulong)uVar10 < local_138._M_string_length + local_b0._M_string_length) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_138._M_dataplus._M_p._4_4_,local_138._M_dataplus._M_p._0_4_) !=
              &local_138.field_2) {
            uVar10 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_138._M_string_length + local_b0._M_string_length)
          goto LAB_001432f3;
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_138,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        }
        else {
LAB_001432f3:
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_b0,
                             (char *)CONCAT44(local_138._M_dataplus._M_p._4_4_,
                                              local_138._M_dataplus._M_p._0_4_),
                             local_138._M_string_length);
        }
        local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar12 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == paVar12) {
          local_50.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_50._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar6->_M_string_length = 0;
        paVar12->_M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_50,": ");
        local_70._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar12 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == paVar12) {
          local_70.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_70._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_70,"close(pipe_fd[0])");
        local_d0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar12 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == paVar12) {
          local_d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_d0._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_d0," != -1");
        local_90._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        _Var7._M_p = (pointer)&pbVar6->field_2;
        if (local_90._M_dataplus._M_p != _Var7._M_p) goto LAB_001437c3;
        local_90.field_2._M_allocated_capacity = *(undefined8 *)_Var7._M_p;
        local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_90._M_dataplus._M_p = (pointer)aiVar15;
      }
      else {
        do {
          iVar2 = close(local_114);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_118;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"CHECK failed: File ","");
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_f0,
                        "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                       );
        pipe_fd = (int  [2])(pbVar6->_M_dataplus)._M_p;
        paVar12 = &pbVar6->field_2;
        if (pipe_fd == (int  [2])paVar12) {
          local_100._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_100._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          pipe_fd = (int  [2])&local_100;
        }
        else {
          local_100._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd
                        ,", line ");
        local_b0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar12 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == paVar12) {
          local_b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_b0._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        local_13c = 0x365;
        StreamableToString<int>(&local_138,&local_13c);
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          uVar10 = local_b0.field_2._M_allocated_capacity;
        }
        sVar11 = local_b0._M_string_length;
        if ((ulong)uVar10 < local_138._M_string_length + local_b0._M_string_length) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_138._M_dataplus._M_p._4_4_,local_138._M_dataplus._M_p._0_4_) !=
              &local_138.field_2) {
            uVar10 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_138._M_string_length + local_b0._M_string_length)
          goto LAB_00143181;
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_138,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        }
        else {
LAB_00143181:
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_b0,
                             (char *)CONCAT44(local_138._M_dataplus._M_p._4_4_,
                                              local_138._M_dataplus._M_p._0_4_),
                             local_138._M_string_length);
        }
        local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar12 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == paVar12) {
          local_50.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_50._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar6->_M_string_length = 0;
        paVar12->_M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_50,": ");
        local_70._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar12 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == paVar12) {
          local_70.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_70._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_70,"close(pipe_fd[1])");
        local_d0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar12 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == paVar12) {
          local_d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_d0._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_d0," != -1");
        local_90._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        _Var7._M_p = (pointer)&pbVar6->field_2;
        if (local_90._M_dataplus._M_p == _Var7._M_p) {
          local_90.field_2._M_allocated_capacity = *(undefined8 *)_Var7._M_p;
          local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_90._M_dataplus._M_p = (pointer)aiVar15;
        }
        else {
          local_90.field_2._M_allocated_capacity = *(undefined8 *)_Var7._M_p;
        }
        local_90._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = _Var7._M_p;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        DeathTestAbort(&local_90);
        pbVar6 = extraout_RAX;
        local_90._M_dataplus._M_p = (pointer)extraout_RDX;
LAB_001437c3:
        local_90.field_2._M_allocated_capacity = *(undefined8 *)_Var7._M_p;
      }
      aiVar16 = (int  [2])&local_f0.field_2;
      paVar12 = &local_100;
      local_90._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = _Var7._M_p;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      DeathTestAbort(&local_90);
LAB_001437f4:
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_f0,0,0,_Var7._M_p,sVar11);
      goto LAB_00143804;
    }
    aiVar16 = (int  [2])&local_100;
    pipe_fd = aiVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"CHECK failed: File ","");
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                       );
    paVar12 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar14 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar14) {
      local_b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_b0._M_dataplus._M_p = (pointer)paVar12;
    }
    else {
      local_b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_b0._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_b0,", line ");
    paVar14 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar8) {
      local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_50._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_50._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    local_138._M_dataplus._M_p._0_4_ = 0x356;
    StreamableToString<int>(&local_f0,(int *)&local_138);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar14) {
      uVar10 = local_50.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_f0._M_string_length + local_50._M_string_length) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar10 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_f0._M_string_length + local_50._M_string_length) goto LAB_0014372a;
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_f0,0,0,local_50._M_dataplus._M_p,local_50._M_string_length);
    }
    else {
LAB_0014372a:
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_50,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    }
    local_70._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar8) {
      local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_70._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    paVar8->_M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70,": ");
    local_d0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar8) {
      local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_d0._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_d0,"child_pid != -1");
    local_90._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar8) {
      local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)aiVar15;
      goto LAB_00143a05;
    }
  }
  local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
LAB_00143a05:
  local_90._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_90);
  if ((int  [2])local_90._M_dataplus._M_p != aiVar15) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar14) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar12) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (pipe_fd != aiVar16) {
    operator_delete((void *)pipe_fd,local_100._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}